

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 SyStrToReal(char *zSrc,sxu32 nLen,void *pOutVal,char **zRest)

{
  int iVar1;
  byte bVar2;
  ushort *puVar3;
  uint uVar4;
  ushort **ppuVar5;
  sxreal *psVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  byte *pbVar11;
  int iVar12;
  byte *pbVar13;
  byte *pbVar14;
  byte *pbVar15;
  byte *pbVar16;
  bool bVar17;
  ulong uVar18;
  double dVar19;
  double local_78;
  int local_58;
  int local_50;
  int local_48;
  
  pbVar16 = (byte *)(zSrc + nLen);
  for (; zSrc < pbVar16; zSrc = (char *)((byte *)zSrc + 1)) {
    ppuVar5 = __ctype_b_loc();
    bVar2 = *zSrc;
    if ((*(byte *)((long)*ppuVar5 + (long)(char)bVar2 * 2 + 1) & 0x20) == 0) {
      if ((bVar2 == 0x2b) || (bVar2 == 0x2d)) {
        bVar17 = bVar2 == 0x2d;
        zSrc = (char *)((byte *)zSrc + 1);
        goto LAB_00118581;
      }
      break;
    }
  }
  bVar17 = false;
LAB_00118581:
  iVar8 = 0xf;
  local_78 = 0.0;
  pbVar13 = (byte *)zSrc;
  for (lVar7 = 0; pbVar15 = (byte *)zSrc + lVar7, pbVar11 = pbVar13, iVar12 = iVar8,
      pbVar15 < pbVar16; lVar7 = lVar7 + 4) {
    ppuVar5 = __ctype_b_loc();
    puVar3 = *ppuVar5;
    pbVar11 = pbVar15;
    if ((*(byte *)((long)puVar3 + (long)(char)*pbVar15 * 2 + 1) & 8) == 0) break;
    local_78 = local_78 * 10.0 + (double)((char)*pbVar15 + -0x30);
    pbVar11 = (byte *)zSrc + lVar7 + 1;
    iVar12 = 0xe;
    if ((pbVar16 <= pbVar11) || ((*(byte *)((long)puVar3 + (long)(char)*pbVar11 * 2 + 1) & 8) == 0))
    {
LAB_00118675:
      iVar12 = iVar12 - (int)lVar7;
      break;
    }
    local_78 = local_78 * 10.0 + (double)((char)*pbVar11 + -0x30);
    pbVar11 = (byte *)zSrc + lVar7 + 2;
    iVar12 = 0xd;
    if ((pbVar16 <= pbVar11) || ((*(byte *)((long)puVar3 + (long)(char)*pbVar11 * 2 + 1) & 8) == 0))
    goto LAB_00118675;
    local_78 = local_78 * 10.0 + (double)((char)*pbVar11 + -0x30);
    pbVar11 = (byte *)zSrc + lVar7 + 3;
    iVar12 = iVar8 + -3;
    if ((pbVar16 <= pbVar11) || ((int)lVar7 == 0xc)) break;
    if ((*(byte *)((long)puVar3 + (long)(char)*pbVar11 * 2 + 1) & 8) == 0) {
      pbVar11 = pbVar13 + 3;
      break;
    }
    local_78 = local_78 * 10.0 + (double)((char)*pbVar11 + -0x30);
    pbVar13 = pbVar13 + 4;
    iVar8 = iVar8 + -4;
  }
  if ((pbVar11 < pbVar16) && ((*pbVar11 | 2) == 0x2e)) {
    pbVar13 = pbVar11 + 1;
    local_58 = iVar12 + -3;
    local_50 = iVar12 + -2;
    local_48 = iVar12 + -1;
    dVar19 = 1.0;
    lVar7 = 0;
    iVar8 = iVar12;
    while( true ) {
      pbVar14 = pbVar11 + lVar7 + 1;
      pbVar15 = pbVar13;
      iVar1 = iVar8;
      if ((pbVar16 <= pbVar14) || (iVar9 = (int)lVar7, iVar12 == iVar9)) goto LAB_00118835;
      ppuVar5 = __ctype_b_loc();
      puVar3 = *ppuVar5;
      pbVar15 = pbVar14;
      if ((*(byte *)((long)puVar3 + (long)(char)*pbVar14 * 2 + 1) & 8) == 0) goto LAB_00118835;
      local_78 = local_78 * 10.0 + (double)((char)*pbVar14 + -0x30);
      dVar19 = dVar19 * 10.0;
      pbVar15 = pbVar11 + lVar7 + 2;
      iVar1 = iVar8 + -1;
      if ((pbVar16 <= pbVar15) || (local_48 == iVar9)) goto LAB_00118835;
      if ((*(byte *)((long)puVar3 + (long)(char)*pbVar15 * 2 + 1) & 8) == 0) break;
      local_78 = local_78 * 10.0 + (double)((char)*pbVar15 + -0x30);
      dVar19 = dVar19 * 10.0;
      pbVar15 = pbVar11 + lVar7 + 3;
      iVar1 = iVar8 + -2;
      if ((pbVar16 <= pbVar15) || (local_50 == iVar9)) goto LAB_00118835;
      if ((*(byte *)((long)puVar3 + (long)(char)*pbVar15 * 2 + 1) & 8) == 0) {
        pbVar15 = pbVar13 + 2;
        goto LAB_00118835;
      }
      local_78 = local_78 * 10.0 + (double)((char)*pbVar15 + -0x30);
      dVar19 = dVar19 * 10.0;
      pbVar14 = pbVar11 + lVar7 + 4;
      iVar1 = iVar8 + -3;
      pbVar15 = pbVar13 + 3;
      if (((pbVar16 <= pbVar14) || (local_58 == iVar9)) ||
         (pbVar15 = pbVar14, (*(byte *)((long)puVar3 + (long)(char)*pbVar14 * 2 + 1) & 8) == 0))
      goto LAB_00118835;
      local_78 = local_78 * 10.0 + (double)((char)*pbVar14 + -0x30);
      dVar19 = dVar19 * 10.0;
      pbVar13 = pbVar13 + 4;
      iVar8 = iVar8 + -4;
      lVar7 = lVar7 + 4;
    }
    pbVar15 = pbVar13 + 1;
LAB_00118835:
    iVar12 = iVar1;
    pbVar11 = pbVar15;
    local_78 = local_78 / dVar19;
  }
  if (bVar17) {
    uVar18 = -(ulong)(local_78 != -local_78);
    local_78 = (double)(~uVar18 & (ulong)local_78 | (ulong)-local_78 & uVar18);
  }
  if (iVar12 < 1) {
    for (; (pbVar11 < pbVar16 && ((*pbVar11 | 0x20) != 0x65)); pbVar11 = pbVar11 + 1) {
    }
  }
  pbVar13 = pbVar11;
  if ((pbVar11 < pbVar16) && ((*pbVar11 | 0x20) == 0x65)) {
    pbVar13 = pbVar11 + 1;
    bVar17 = true;
    if ((pbVar13 < pbVar16) && ((bVar2 = *pbVar13, bVar2 == 0x2d || (bVar2 == 0x2b)))) {
      bVar17 = bVar2 != 0x2d;
      pbVar13 = pbVar11 + 2;
    }
    uVar10 = 0;
    for (; pbVar13 < pbVar16; pbVar13 = pbVar13 + 1) {
      ppuVar5 = __ctype_b_loc();
      if (((*(byte *)((long)*ppuVar5 + (long)(char)*pbVar13 * 2 + 1) & 8) == 0) ||
         (0x133 < (int)uVar10)) break;
      uVar10 = (uVar10 * 10 + (int)(char)*pbVar13) - 0x30;
    }
    if (bVar17) {
      uVar4 = 0x134;
    }
    else {
      uVar4 = 0x133;
    }
    if ((int)uVar10 < (int)uVar4) {
      uVar4 = uVar10;
    }
    psVar6 = SyStrToReal::aTab;
    for (; uVar4 != 0; uVar4 = (int)uVar4 >> 1) {
      if ((uVar4 & 1) != 0) {
        if (bVar17) {
          local_78 = local_78 * *psVar6;
        }
        else {
          local_78 = local_78 / *psVar6;
        }
      }
      psVar6 = psVar6 + 1;
    }
  }
  do {
    if (pbVar16 <= pbVar13) break;
    ppuVar5 = __ctype_b_loc();
    bVar2 = *pbVar13;
    pbVar13 = pbVar13 + 1;
  } while ((*(byte *)((long)*ppuVar5 + (long)(char)bVar2 * 2 + 1) & 0x20) != 0);
  if (pOutVal != (void *)0x0) {
    *(double *)pOutVal = local_78;
  }
  return (sxi32)pOutVal;
}

Assistant:

JX9_PRIVATE sxi32 SyStrToReal(const char *zSrc, sxu32 nLen, void * pOutVal, const char **zRest)
{
#define SXDBL_DIG        15
#define SXDBL_MAX_EXP    308
#define SXDBL_MIN_EXP_PLUS	307
	static const sxreal aTab[] = {
	10, 
	1.0e2, 
	1.0e4, 
	1.0e8, 
	1.0e16, 
	1.0e32, 
	1.0e64, 
	1.0e128, 
	1.0e256
	};
	sxu8 neg = FALSE;
	sxreal Val = 0.0;
	const char *zEnd;
	sxi32 Lim, exp;
	sxreal *p = 0;
#ifdef UNTRUST
	if( SX_EMPTY_STR(zSrc)  ){
		if( pOutVal ){
			*(sxreal *)pOutVal = 0.0;
		}
		return SXERR_EMPTY;
	}
#endif
	zEnd = &zSrc[nLen];
	while( zSrc < zEnd && SyisSpace(zSrc[0]) ){
		zSrc++; 
	}
	if( zSrc < zEnd && (zSrc[0] == '-' || zSrc[0] == '+' ) ){
		neg =  zSrc[0] == '-' ? TRUE : FALSE ;
		zSrc++;
	}
	Lim = SXDBL_DIG ;
	for(;;){
		if(zSrc >= zEnd||!Lim||!SyisDigit(zSrc[0])) break ; Val = Val * 10.0 + (zSrc[0] - '0') ; zSrc++ ; --Lim;
		if(zSrc >= zEnd||!Lim||!SyisDigit(zSrc[0])) break ; Val = Val * 10.0 + (zSrc[0] - '0') ; zSrc++ ; --Lim;
		if(zSrc >= zEnd||!Lim||!SyisDigit(zSrc[0])) break ; Val = Val * 10.0 + (zSrc[0] - '0') ; zSrc++ ; --Lim;
		if(zSrc >= zEnd||!Lim||!SyisDigit(zSrc[0])) break ; Val = Val * 10.0 + (zSrc[0] - '0') ; zSrc++ ; --Lim;
	}
	if( zSrc < zEnd && ( zSrc[0] == '.' || zSrc[0] == ',' ) ){
		sxreal dec = 1.0;
		zSrc++;
		for(;;){
			if(zSrc >= zEnd||!Lim||!SyisDigit(zSrc[0])) break ; Val = Val * 10.0 + (zSrc[0] - '0') ; dec *= 10.0; zSrc++ ;--Lim;
			if(zSrc >= zEnd||!Lim||!SyisDigit(zSrc[0])) break ; Val = Val * 10.0 + (zSrc[0] - '0') ; dec *= 10.0; zSrc++ ;--Lim;
			if(zSrc >= zEnd||!Lim||!SyisDigit(zSrc[0])) break ; Val = Val * 10.0 + (zSrc[0] - '0') ; dec *= 10.0; zSrc++ ;--Lim;
			if(zSrc >= zEnd||!Lim||!SyisDigit(zSrc[0])) break ; Val = Val * 10.0 + (zSrc[0] - '0') ; dec *= 10.0; zSrc++ ;--Lim;
		}
		Val /= dec;
	}
	if( neg == TRUE && Val != 0.0 ) {
		Val = -Val ; 
	}
	if( Lim <= 0 ){
		/* jump overflow digit */
		while( zSrc < zEnd ){
			if( zSrc[0] == 'e' || zSrc[0] == 'E' ){
				break;  
			}
			zSrc++;
		}
	}
	neg = FALSE;
	if( zSrc < zEnd && ( zSrc[0] == 'e' || zSrc[0] == 'E' ) ){
		zSrc++;
		if( zSrc < zEnd && ( zSrc[0] == '-' || zSrc[0] == '+') ){
			neg = zSrc[0] == '-' ? TRUE : FALSE ;
			zSrc++;
		}
		exp = 0;
		while( zSrc < zEnd && SyisDigit(zSrc[0]) && exp < SXDBL_MAX_EXP ){
			exp = exp * 10 + (zSrc[0] - '0');
			zSrc++;
		}
		if( neg  ){
			if( exp > SXDBL_MIN_EXP_PLUS ) exp = SXDBL_MIN_EXP_PLUS ;
		}else if ( exp > SXDBL_MAX_EXP ){
			exp = SXDBL_MAX_EXP; 
		}		
		for( p = (sxreal *)aTab ; exp ; exp >>= 1 , p++ ){
			if( exp & 01 ){
				if( neg ){
					Val /= *p ;
				}else{
					Val *= *p;
				}
			}
		}
	}
	while( zSrc < zEnd && SyisSpace(zSrc[0]) ){
		zSrc++;
	}
	if( zRest ){
		*zRest = zSrc; 
	}
	if( pOutVal ){
		*(sxreal *)pOutVal = Val;
	}
	return zSrc >= zEnd ? SXRET_OK : SXERR_SYNTAX;
}